

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::EnumOptions::MergeFrom(EnumOptions *this,EnumOptions *from)

{
  bool bVar1;
  int iVar2;
  UninterpretedOption *from_00;
  void **ppvVar3;
  LogMessage *other;
  UninterpretedOption *this_00;
  int iVar4;
  long lVar5;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1799);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ +
             (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      from_00 = (UninterpretedOption *)
                (from->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar5];
      iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar4) {
        ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (UninterpretedOption *)ppvVar3[iVar2];
      }
      else {
        if (iVar4 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar4 + 1);
          iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_ = iVar4 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
        ppvVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = this_00;
      }
      UninterpretedOption::MergeFrom(this_00,from_00);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((from->_has_bits_[0] & 1) != 0) {
    bVar1 = from->allow_alias_;
    this->_has_bits_[0] = this->_has_bits_[0] | 1;
    this->allow_alias_ = bVar1;
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void EnumOptions::MergeFrom(const EnumOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_allow_alias()) {
      set_allow_alias(from.allow_alias());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}